

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Noise::run(Nes_Noise *this,nes_time_t time,nes_time_t end_time)

{
  uchar uVar1;
  blip_ulong bVar2;
  Blip_Buffer *pBVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  blip_resampled_time_t time_00;
  uint uVar8;
  int iVar9;
  
  iVar7 = (int)noise_period_table[(this->super_Nes_Envelope).super_Nes_Osc.regs[2] & 0xf];
  pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar3 == (Blip_Buffer *)0x0) {
    iVar9 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
    iVar5 = (iVar7 + end_time) - iVar9;
    (this->super_Nes_Envelope).super_Nes_Osc.delay =
         (iVar9 - ((iVar5 + -1) % iVar7 + end_time)) + iVar5 + -1;
    return;
  }
  pBVar3->modified_ = 1;
  uVar4 = Nes_Envelope::volume(&this->super_Nes_Envelope);
  iVar5 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
  uVar6 = -(this->noise & 1U) & uVar4;
  (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar6;
  iVar5 = uVar6 - iVar5;
  if (iVar5 != 0) {
    Blip_Synth<8,_1>::offset(&this->synth,time,iVar5,pBVar3);
  }
  uVar8 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
  if ((int)uVar8 < end_time) {
    if (uVar4 == 0) {
      iVar5 = ~uVar8 + end_time + iVar7;
      uVar8 = (iVar5 - iVar5 % iVar7) + uVar8;
      if ((char)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] < '\0') goto LAB_0056cab6;
      iVar7 = this->noise;
      uVar6 = iVar7 >> 1 | (iVar7 << 0xe ^ iVar7 << 0xd) & 0x4000U;
    }
    else {
      pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
      bVar2 = pBVar3->factor_;
      time_00 = bVar2 * uVar8 + pBVar3->offset_;
      iVar5 = uVar6 * 2 - uVar4;
      uVar1 = (this->super_Nes_Envelope).super_Nes_Osc.regs[2];
      uVar6 = this->noise;
      do {
        if ((uVar6 + 1 & 2) != 0) {
          iVar5 = -iVar5;
          Blip_Synth<8,_1>::offset_resampled(&this->synth,time_00,iVar5,pBVar3);
        }
        uVar8 = uVar8 + iVar7;
        time_00 = time_00 + bVar2 * iVar7;
        uVar6 = (int)uVar6 >> 1 | (uVar6 << (-1 < (char)uVar1) * '\x05' + 8 ^ uVar6 << 0xe) & 0x4000
        ;
      } while ((int)uVar8 < end_time);
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar5 + uVar4) >> 1;
    }
    this->noise = uVar6;
  }
LAB_0056cab6:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = uVar8 - end_time;
  return;
}

Assistant:

void Nes_Noise::run( nes_time_t time, nes_time_t end_time )
{
	int period = noise_period_table [regs [2] & 15];
	
	if ( !output )
	{
		// TODO: clean up
		time += delay;
		delay = time + (end_time - time + period - 1) / period * period - end_time;
		return;
	}
	
	output->set_modified();
	
	const int volume = this->volume();
	int amp = (noise & 1) ? volume : 0;
	{
		int delta = update_amp( amp );
		if ( delta )
			synth.offset( time, delta, output );
	}
	
	time += delay;
	if ( time < end_time )
	{
		const int mode_flag = 0x80;
		
		if ( !volume )
		{
			// round to next multiple of period
			time += (end_time - time + period - 1) / period * period;
			
			// approximate noise cycling while muted, by shuffling up noise register
			// to do: precise muted noise cycling?
			if ( !(regs [2] & mode_flag) ) {
				int feedback = (noise << 13) ^ (noise << 14);
				noise = (feedback & 0x4000) | (noise >> 1);
			}
		}
		else
		{
			Blip_Buffer* const output = this->output;
			
			// using resampled time avoids conversion in synth.offset()
			blip_resampled_time_t rperiod = output->resampled_duration( period );
			blip_resampled_time_t rtime = output->resampled_time( time );
			
			int noise = this->noise;
			int delta = amp * 2 - volume;
			const int tap = (regs [2] & mode_flag ? 8 : 13);
			
			do {
				int feedback = (noise << tap) ^ (noise << 14);
				time += period;
				
				if ( (noise + 1) & 2 ) {
					// bits 0 and 1 of noise differ
					delta = -delta;
					synth.offset_resampled( rtime, delta, output );
				}
				
				rtime += rperiod;
				noise = (feedback & 0x4000) | (noise >> 1);
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->noise = noise;
		}
	}
	
	delay = time - end_time;
}